

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O3

void gen_bswap16x8(TCGContext_conflict10 *tcg_ctx,TCGv_i64 outh,TCGv_i64 outl,TCGv_i64 inh,
                  TCGv_i64 inl)

{
  TCGv_i64 pTVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGv_i64 ret;
  uintptr_t o;
  uintptr_t o_3;
  
  pTVar1 = tcg_const_i64_ppc64(tcg_ctx,0xff00ff00ff00ff);
  ts = tcg_temp_new_internal_ppc64(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)ts - (long)tcg_ctx);
  ts_00 = tcg_temp_new_internal_ppc64(tcg_ctx,TCG_TYPE_I64,false);
  ts_01 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts,(TCGArg)(inh + (long)&tcg_ctx->pool_cur),
                    (TCGArg)ts_01);
  tcg_gen_shli_i64_ppc64(tcg_ctx,ret,ret,8);
  tcg_gen_shri_i64_ppc64(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),inh,8);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts_00,(TCGArg)ts_00,(TCGArg)ts_01);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_or_i64,(TCGArg)(outh + (long)tcg_ctx),(TCGArg)ts,(TCGArg)ts_00)
  ;
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts,(TCGArg)(inl + (long)&tcg_ctx->pool_cur),
                    (TCGArg)ts_01);
  tcg_gen_shli_i64_ppc64(tcg_ctx,ret,ret,8);
  tcg_gen_shri_i64_ppc64(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),inl,8);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts_00,(TCGArg)ts_00,(TCGArg)ts_01);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_or_i64,(TCGArg)(outl + (long)tcg_ctx),(TCGArg)ts,(TCGArg)ts_00)
  ;
  tcg_temp_free_internal_ppc64(tcg_ctx,ts);
  tcg_temp_free_internal_ppc64(tcg_ctx,ts_00);
  tcg_temp_free_internal_ppc64(tcg_ctx,ts_01);
  return;
}

Assistant:

static void gen_bswap16x8(TCGContext *tcg_ctx, TCGv_i64 outh, TCGv_i64 outl,
                          TCGv_i64 inh, TCGv_i64 inl)
{
    TCGv_i64 mask = tcg_const_i64(tcg_ctx, 0x00FF00FF00FF00FF);
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    /* outh = ((inh & mask) << 8) | ((inh >> 8) & mask) */
    tcg_gen_and_i64(tcg_ctx, t0, inh, mask);
    tcg_gen_shli_i64(tcg_ctx, t0, t0, 8);
    tcg_gen_shri_i64(tcg_ctx, t1, inh, 8);
    tcg_gen_and_i64(tcg_ctx, t1, t1, mask);
    tcg_gen_or_i64(tcg_ctx, outh, t0, t1);

    /* outl = ((inl & mask) << 8) | ((inl >> 8) & mask) */
    tcg_gen_and_i64(tcg_ctx, t0, inl, mask);
    tcg_gen_shli_i64(tcg_ctx, t0, t0, 8);
    tcg_gen_shri_i64(tcg_ctx, t1, inl, 8);
    tcg_gen_and_i64(tcg_ctx, t1, t1, mask);
    tcg_gen_or_i64(tcg_ctx, outl, t0, t1);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, mask);
}